

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nqueens.c
# Opt level: O3

void run_CALL(WorkerP *w,Task *__dq_head)

{
  long lVar1;
  FILE *pFVar2;
  ulong uVar3;
  __time_t _Var4;
  __suseconds_t _Var5;
  MTBDD MVar6;
  size_t sVar7;
  size_t k_1;
  ulong uVar8;
  char *pcVar9;
  size_t k_3;
  BDD BVar10;
  size_t k;
  ulong uVar11;
  size_t k_2;
  MTBDD *a;
  ulong uVar12;
  MTBDD *pMVar13;
  double dVar14;
  double dVar15;
  ulong auStack_c0 [2];
  BDD local_b0;
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *local_a8;
  long local_a0;
  MTBDD local_98;
  BDD vars;
  undefined1 local_88 [8];
  timeval tv;
  MTBDD local_48;
  BDD temp;
  BDD res;
  
  auStack_c0[0] = 0x10356e;
  gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
  _Var4 = tv.tv_sec;
  local_a8 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)local_88;
  lVar1 = -(size * size * 8 + 0xf & 0xfffffffffffffff0);
  pMVar13 = (MTBDD *)((long)auStack_c0 + lVar1 + 8);
  if (size != 0) {
    uVar8 = 0;
    a = pMVar13;
    do {
      *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1035b0;
      MVar6 = mtbdd_ithvar((uint32_t)uVar8);
      *a = MVar6;
      *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1035bb;
      mtbdd_protect(a);
      uVar8 = uVar8 + 1;
      a = a + 1;
    } while (uVar8 < size * size);
  }
  temp = 0x8000000000000000;
  local_48 = 0x8000000000000000;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1035ef;
  mtbdd_protect(&temp);
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1035f7;
  mtbdd_protect(&local_48);
  local_98 = 0x8000000000000000;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103606;
  mtbdd_protect(&local_98);
  if (size != 0) {
    uVar8 = 0;
    do {
      local_88 = (undefined1  [8])sylvan_and_WRAP;
      tv.tv_sec = 1;
      tv.tv_usec = local_98;
      *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10364c;
      lace_run_task((Task *)local_88);
      local_98 = tv.tv_usec;
      uVar8 = uVar8 + 1;
    } while (uVar8 < size * size);
  }
  pFVar2 = _stdout;
  vars = (BDD)pMVar13;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103689;
  gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
  dVar15 = (double)(long)local_88;
  dVar14 = (double)tv.tv_sec;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1036b9;
  fprintf(pFVar2,"[% 8.2f] Initialisation complete!\n",(dVar14 * 1e-06 + dVar15) - t_start);
  pFVar2 = _stdout;
  local_a0 = _Var4;
  if (report_minor == '\0') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103703;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Encoding rows...\n";
  }
  else {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1036d6;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Encoding rows... ";
  }
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103739;
  fprintf(pFVar2,pcVar9,dVar14 - t_start);
  if (size != 0) {
    res = 0;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10376f;
        printf("%zu... ");
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10377e;
        fflush(_stdout);
        if (size == 0) break;
      }
      uVar8 = 0;
      do {
        tv.tv_usec = 0x8000000000000000;
        local_48 = 0x8000000000000000;
        uVar11 = 0;
        sVar7 = size;
        do {
          if (uVar8 != uVar11) {
            local_88 = (undefined1  [8])sylvan_and_WRAP;
            tv.tv_sec = 1;
            *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1037e9;
            lace_run_task((Task *)local_88);
            local_48 = tv.tv_usec;
            sVar7 = size;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < sVar7);
        tv.tv_usec = tv.tv_usec ^ 0x8000000000000000;
        local_88 = (undefined1  [8])sylvan_and_WRAP;
        tv.tv_sec = 1;
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103847;
        lace_run_task((Task *)local_88);
        local_48 = tv.tv_usec ^ 0x8000000000000000;
        local_88 = (undefined1  [8])sylvan_and_WRAP;
        tv.tv_sec = 1;
        tv.tv_usec = temp;
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10387d;
        lace_run_task((Task *)local_88);
        temp = tv.tv_usec;
        uVar8 = uVar8 + 1;
      } while (uVar8 < size);
      res = res + 1;
    } while (res < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1038c3;
    putchar(10);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1038e8;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    res = (BDD)(((double)tv.tv_sec * 1e-06 + (double)(long)local_88) - t_start);
    local_88 = (undefined1  [8])sylvan_satcount_WRAP;
    tv.tv_sec = 1;
    tv.tv_usec = temp;
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103947;
    lace_run_task((Task *)local_88);
    BVar10 = res;
    _Var5 = tv.tv_usec;
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103963;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",BVar10,_Var5);
  }
  pFVar2 = _stdout;
  if (report_minor == '\x01') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103984;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Encoding columns... ";
  }
  else {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1039b8;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Encoding columns...\n";
  }
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1039ee;
  fprintf(pFVar2,pcVar9,dVar14 - t_start);
  if (size != 0) {
    uVar8 = 0;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103a1a;
        printf("%zu... ");
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103a29;
        fflush(_stdout);
        if (size == 0) break;
      }
      uVar11 = 0;
      res = uVar8;
      do {
        tv.tv_usec = 0x8000000000000000;
        local_48 = 0x8000000000000000;
        uVar8 = 0;
        sVar7 = size;
        do {
          if (uVar11 != uVar8) {
            local_88 = (undefined1  [8])sylvan_and_WRAP;
            tv.tv_sec = 1;
            *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103a9b;
            lace_run_task((Task *)local_88);
            local_48 = tv.tv_usec;
            sVar7 = size;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < sVar7);
        tv.tv_usec = tv.tv_usec ^ 0x8000000000000000;
        local_88 = (undefined1  [8])sylvan_and_WRAP;
        tv.tv_sec = 1;
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103aeb;
        lace_run_task((Task *)local_88);
        local_48 = tv.tv_usec ^ 0x8000000000000000;
        local_88 = (undefined1  [8])sylvan_and_WRAP;
        tv.tv_sec = 1;
        tv.tv_usec = temp;
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103b20;
        lace_run_task((Task *)local_88);
        temp = tv.tv_usec;
        uVar11 = uVar11 + 1;
      } while (uVar11 < size);
      uVar8 = res + 1;
    } while (uVar8 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103b5e;
    putchar(10);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103b83;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    res = (BDD)(((double)tv.tv_sec * 1e-06 + (double)(long)local_88) - t_start);
    local_88 = (undefined1  [8])sylvan_satcount_WRAP;
    tv.tv_sec = 1;
    tv.tv_usec = temp;
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103be2;
    lace_run_task((Task *)local_88);
    BVar10 = res;
    _Var5 = tv.tv_usec;
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103bfe;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",BVar10,_Var5);
  }
  pFVar2 = _stdout;
  if (report_minor == '\x01') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103c1f;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Encoding rising diagonals... ";
  }
  else {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103c53;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Encoding rising diagonals...\n";
  }
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103c89;
  fprintf(pFVar2,pcVar9,dVar14 - t_start);
  if (size != 0) {
    uVar8 = 0;
    BVar10 = vars;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103cbd;
        printf("%zu... ");
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103ccc;
        fflush(_stdout);
        if (size == 0) break;
      }
      uVar11 = 0;
      res = BVar10;
      do {
        tv.tv_usec = 0x8000000000000000;
        local_48 = 0x8000000000000000;
        uVar12 = 0;
        sVar7 = size;
        do {
          if (((uVar8 != uVar12) && (uVar8 <= uVar12 + uVar11)) && (uVar12 + uVar11 < sVar7 + uVar8)
             ) {
            local_88 = (undefined1  [8])sylvan_and_WRAP;
            tv.tv_sec = 1;
            *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103d49;
            lace_run_task((Task *)local_88);
            local_48 = tv.tv_usec;
            sVar7 = size;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < sVar7);
        tv.tv_usec = tv.tv_usec ^ 0x8000000000000000;
        local_88 = (undefined1  [8])sylvan_and_WRAP;
        tv.tv_sec = 1;
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103db3;
        lace_run_task((Task *)local_88);
        local_48 = tv.tv_usec ^ 0x8000000000000000;
        local_88 = (undefined1  [8])sylvan_and_WRAP;
        tv.tv_sec = 1;
        tv.tv_usec = temp;
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103dea;
        lace_run_task((Task *)local_88);
        temp = tv.tv_usec;
        uVar11 = uVar11 + 1;
      } while (uVar11 < size);
      uVar8 = uVar8 + 1;
      BVar10 = res - 8;
    } while (uVar8 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103e33;
    putchar(10);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103e58;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    res = (BDD)(((double)tv.tv_sec * 1e-06 + (double)(long)local_88) - t_start);
    local_88 = (undefined1  [8])sylvan_satcount_WRAP;
    tv.tv_sec = 1;
    tv.tv_usec = temp;
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103eb7;
    lace_run_task((Task *)local_88);
    BVar10 = res;
    _Var5 = tv.tv_usec;
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103ed3;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",BVar10,_Var5);
  }
  pFVar2 = _stdout;
  if (report_minor == '\x01') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103ef4;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Encoding falling diagonals... ";
  }
  else {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103f28;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Encoding falling diagonals...\n";
  }
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103f5e;
  fprintf(pFVar2,pcVar9,dVar14 - t_start);
  if (size != 0) {
    uVar8 = 0;
    BVar10 = vars;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103f92;
        printf("%zu... ");
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103fa1;
        fflush(_stdout);
        if (size == 0) break;
      }
      uVar11 = 0;
      local_b0 = BVar10;
      do {
        tv.tv_usec = 0x8000000000000000;
        local_48 = 0x8000000000000000;
        uVar12 = 0;
        sVar7 = size;
        auStack_c0[1] = uVar11;
        res = BVar10;
        do {
          if (((uVar8 != uVar12) && (uVar12 <= uVar11 + uVar8)) && (uVar11 + uVar8 < sVar7 + uVar12)
             ) {
            local_88 = (undefined1  [8])sylvan_and_WRAP;
            tv.tv_sec = 1;
            *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10402a;
            lace_run_task((Task *)local_88);
            local_48 = tv.tv_usec;
            sVar7 = size;
          }
          uVar3 = auStack_c0[1];
          uVar12 = uVar12 + 1;
        } while (uVar12 < sVar7);
        tv.tv_usec = tv.tv_usec ^ 0x8000000000000000;
        local_88 = (undefined1  [8])sylvan_and_WRAP;
        tv.tv_sec = 1;
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10409f;
        lace_run_task((Task *)local_88);
        local_48 = tv.tv_usec ^ 0x8000000000000000;
        local_88 = (undefined1  [8])sylvan_and_WRAP;
        tv.tv_sec = 1;
        tv.tv_usec = temp;
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1040cf;
        lace_run_task((Task *)local_88);
        temp = tv.tv_usec;
        uVar11 = uVar3 + 1;
        BVar10 = res + 8;
      } while (uVar11 < size);
      uVar8 = uVar8 + 1;
      BVar10 = local_b0 + 8;
    } while (uVar8 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x104122;
    putchar(10);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x104147;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    res = (BDD)(((double)tv.tv_sec * 1e-06 + (double)(long)local_88) - t_start);
    local_88 = (undefined1  [8])sylvan_satcount_WRAP;
    tv.tv_sec = 1;
    tv.tv_usec = temp;
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1041a6;
    lace_run_task((Task *)local_88);
    BVar10 = res;
    _Var5 = tv.tv_usec;
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1041c2;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",BVar10,_Var5);
  }
  pFVar2 = _stdout;
  if (report_minor == '\x01') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1041e3;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Final computation to place a queen on every row... ";
  }
  else {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x104217;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Final computation to place a queen on every row...\n";
  }
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10424d;
  fprintf(pFVar2,pcVar9,dVar14 - t_start);
  if (size != 0) {
    uVar8 = 0;
    do {
      res = uVar8;
      if (report_minor == '\0') {
LAB_001042ce:
        local_48 = 0;
        tv.tv_usec = -0x8000000000000000;
        uVar8 = 0;
        do {
          local_88 = (undefined1  [8])sylvan_and_WRAP;
          tv.tv_sec = 1;
          *(undefined8 *)((long)auStack_c0 + lVar1) = 0x104304;
          lace_run_task((Task *)local_88);
          local_48 = tv.tv_usec ^ 0x8000000000000000;
          uVar8 = uVar8 + 1;
        } while (uVar8 < size);
      }
      else {
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10428b;
        printf("%zu... ");
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10429a;
        fflush(_stdout);
        local_48 = 0;
        if (size != 0) goto LAB_001042ce;
      }
      local_88 = (undefined1  [8])sylvan_and_WRAP;
      tv.tv_sec = 1;
      tv.tv_usec = temp;
      *(undefined8 *)((long)auStack_c0 + lVar1) = 0x104352;
      lace_run_task((Task *)local_88);
      temp = tv.tv_usec;
      uVar8 = res + 1;
    } while (uVar8 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x104388;
    putchar(10);
  }
  vars = (BDD)((double)local_a0 * 1e-06 + (double)(long)local_a8);
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1043c2;
  gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
  pFVar2 = _stdout;
  vars = (BDD)(((double)tv.tv_sec * 1e-06 + (double)(long)local_88) - (double)vars);
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x104408;
  gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
  sVar7 = size;
  res = (BDD)(((double)tv.tv_sec * 1e-06 + (double)(long)local_88) - t_start);
  local_88 = (undefined1  [8])sylvan_satcount_WRAP;
  tv.tv_sec = 1;
  tv.tv_usec = temp;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10446e;
  lace_run_task((Task *)local_88);
  BVar10 = res;
  _Var5 = tv.tv_usec;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10448d;
  fprintf(pFVar2,"[% 8.2f] Result: NQueens(%zu) has %.0f solutions.\n",BVar10,_Var5,sVar7);
  pFVar2 = _stdout;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10449b;
  gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
  res = (BDD)(((double)tv.tv_sec * 1e-06 + (double)(long)local_88) - t_start);
  local_88 = (undefined1  [8])temp;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1044da;
  sVar7 = mtbdd_nodecount_more((MTBDD *)local_88,1);
  BVar10 = res;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1044f3;
  fprintf(pFVar2,"[% 8.2f] Result BDD has %zu nodes.\n",BVar10,sVar7);
  pFVar2 = _stdout;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x104501;
  gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
  BVar10 = vars;
  dVar15 = (double)(long)local_88;
  dVar14 = (double)tv.tv_sec;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10453f;
  fprintf(pFVar2,"[% 8.2f] Computation time: %f sec.\n",(dVar14 * 1e-06 + dVar15) - t_start,BVar10);
  return;
}

Assistant:

VOID_TASK_0(run)
{
    double t1 = wctime();

    BDD zero = sylvan_false;
    BDD one = sylvan_true;

    // Variables 0 ... (SIZE*SIZE-1)

    BDD board[size*size];
    for (size_t i=0; i<size*size; i++) {
        board[i] = sylvan_ithvar(i);
        sylvan_protect(board+i);
    }

    BDD res = one, temp = one;

    // we use sylvan's "protect" marking mechanism...
    // that means we hardly need to do manual ref/deref when the variables change
    sylvan_protect(&res);
    sylvan_protect(&temp);

    // Old satcount function still requires a silly variables cube
    BDD vars = one;
    sylvan_protect(&vars);
    for (size_t i=0; i<size*size; i++) vars = sylvan_and(vars, board[i]);

    INFO("Initialisation complete!\n");

    if (report_minor) {
        INFO("Encoding rows... ");
    } else {
        INFO("Encoding rows...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            // compute "\BigAnd (!board[i][k]) \or !board[i][j]" with k != j
            temp = one;
            for (size_t k=0; k<size; k++) {
                if (j==k) continue;
                temp = sylvan_and(temp, sylvan_not(board[i*size+k]));
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding columns... ");
    } else {
        INFO("Encoding columns...\n");
    }

    for (size_t j=0; j<size; j++) {
        if (report_minor) {
            printf("%zu... ", j);
            fflush(stdout);
        }

        for (size_t i=0; i<size; i++) {
            // compute "\BigAnd (!board[k][j]) \or !board[i][j]" with k != i
            temp = one;
            for (size_t k=0; k<size; k++) {
                if (i==k) continue;
                temp = sylvan_and(temp, sylvan_not(board[k*size+j]));
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding rising diagonals... ");
    } else {
        INFO("Encoding rising diagonals...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            temp = one;
            for (size_t k=0; k<size; k++) {
                // if (j+k-i >= 0 && j+k-i < size && k != i)
                if (j+k >= i && j+k < size+i && k != i) {
                    temp = sylvan_and(temp, sylvan_not(board[k*size + (j+k-i)]));
                }
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding falling diagonals... ");
    } else {
        INFO("Encoding falling diagonals...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            temp = one;
            for (size_t k=0; k<size; k++) {
                // if (j+i-k >= 0 && j+i-k < size && k != i)
                if (j+i >= k && j+i < size+k && k != i) {
                    temp = sylvan_and(temp, sylvan_not(board[k*size + (j+i-k)]));
                }
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size + j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Final computation to place a queen on every row... ");
    } else {
        INFO("Final computation to place a queen on every row...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        temp = zero;
        for (size_t j=0; j<size; j++) {
            temp = sylvan_or(temp, board[i*size+j]);
        }
        res = sylvan_and(res, temp);
    }

    if (report_minor) {
        printf("\n");
    }

    double t2 = wctime();

    INFO("Result: NQueens(%zu) has %.0f solutions.\n", size, sylvan_satcount(res, vars));
    INFO("Result BDD has %zu nodes.\n", sylvan_nodecount(res));
    INFO("Computation time: %f sec.\n", t2-t1);
}